

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

float ImGui::RoundScalarWithFormatT<float>(char *format,ImGuiDataType data_type,float v)

{
  char *pcVar1;
  byte bVar2;
  byte *pbVar3;
  byte *pbVar4;
  uint uVar5;
  char *__nptr;
  double dVar6;
  char fmt_sanitized [32];
  char v_str [64];
  byte local_68 [31];
  char local_49;
  char local_48 [64];
  
  bVar2 = *format;
  while( true ) {
    if (bVar2 == 0) {
      return v;
    }
    if ((bVar2 == 0x25) && (((byte *)format)[1] != 0x25)) break;
    format = (char *)((byte *)format + (ulong)(bVar2 == 0x25) + 1);
    bVar2 = *format;
  }
  pbVar3 = (byte *)ImParseFormatFindEnd(format);
  pbVar4 = local_68;
  if (format < pbVar3) {
    do {
      uVar5 = (byte)*format - 0x24;
      if ((0x3b < uVar5) || ((0x800000000000009U >> ((ulong)uVar5 & 0x3f) & 1) == 0)) {
        *pbVar4 = *format;
        pbVar4 = pbVar4 + 1;
      }
      format = (char *)((byte *)format + 1);
    } while ((byte *)format != pbVar3);
  }
  *pbVar4 = 0;
  ImFormatString(local_48,0x40,(char *)local_68,(double)v);
  __nptr = &local_49;
  do {
    pcVar1 = __nptr + 1;
    __nptr = __nptr + 1;
  } while (*pcVar1 == ' ');
  dVar6 = atof(__nptr);
  return (float)dVar6;
}

Assistant:

const char* ImParseFormatFindStart(const char* fmt)
{
    while (char c = fmt[0])
    {
        if (c == '%' && fmt[1] != '%')
            return fmt;
        else if (c == '%')
            fmt++;
        fmt++;
    }
    return fmt;
}